

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psftp.c
# Opt level: O3

wchar_t sftp_cmd_open(sftp_command *cmd)

{
  char **ppcVar1;
  uint uVar2;
  wchar_t wVar3;
  wchar_t in_EDX;
  wchar_t extraout_EDX;
  char *pcVar4;
  
  if (backend == (Backend *)0x0) {
    if (1 < cmd->nwords) {
      pcVar4 = (char *)0x0;
      ppcVar1 = cmd->words;
      if (cmd->nwords != 2) {
        uVar2 = atoi(ppcVar1[2]);
        pcVar4 = (char *)(ulong)uVar2;
        in_EDX = extraout_EDX;
        if (uVar2 == 0) {
          pcVar4 = "open: invalid port number";
          goto LAB_00112e81;
        }
      }
      wVar3 = psftp_connect(ppcVar1[1],pcVar4,in_EDX);
      if (wVar3 != L'\0') {
        backend = (Backend *)0x0;
        return L'\xffffffff';
      }
      do_sftp_init();
      return L'\x01';
    }
    pcVar4 = "open: expects a host name";
  }
  else {
    pcVar4 = "psftp: already connected";
  }
LAB_00112e81:
  puts(pcVar4);
  return L'\0';
}

Assistant:

static int sftp_cmd_open(struct sftp_command *cmd)
{
    int portnumber;

    if (backend) {
        printf("psftp: already connected\n");
        return 0;
    }

    if (cmd->nwords < 2) {
        printf("open: expects a host name\n");
        return 0;
    }

    if (cmd->nwords > 2) {
        portnumber = atoi(cmd->words[2]);
        if (portnumber == 0) {
            printf("open: invalid port number\n");
            return 0;
        }
    } else
        portnumber = 0;

    if (psftp_connect(cmd->words[1], NULL, portnumber)) {
        backend = NULL;                /* connection is already closed */
        return -1;                     /* this is fatal */
    }
    do_sftp_init();
    return 1;
}